

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::removeTabButNotChild(CGUITabControl *this,s32 idx)

{
  pointer ppIVar1;
  IGUITab *pIVar2;
  int iVar3;
  
  if (idx < 0) {
    return;
  }
  ppIVar1 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3) <= idx)
  {
    return;
  }
  pIVar2 = ppIVar1[(uint)idx];
  IReferenceCounted::drop
            ((IReferenceCounted *)
             ((long)&(pIVar2->super_IGUIElement).super_IEventReceiver +
             *(long *)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + -0x18)));
  core::array<irr::gui::IGUITab_*>::erase(&this->Tabs,idx);
  iVar3 = this->ActiveTabIndex;
  if (iVar3 <= idx) {
    if (iVar3 != idx) {
      return;
    }
    iVar3 = idx;
    if ((int)((ulong)((long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Tabs).m_data.
                           super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) != idx)
    goto LAB_00238ebd;
  }
  idx = iVar3 + -1;
  this->ActiveTabIndex = idx;
LAB_00238ebd:
  setVisibleTab(this,idx);
  return;
}

Assistant:

void CGUITabControl::removeTabButNotChild(s32 idx)
{
	if (idx < 0 || idx >= (s32)Tabs.size())
		return;

	Tabs[(u32)idx]->drop();
	Tabs.erase((u32)idx);

	if (idx < ActiveTabIndex) {
		--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	} else if (idx == ActiveTabIndex) {
		if ((u32)idx == Tabs.size())
			--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}
}